

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergePartialFromImpl<true>
          (internal *this,StringPiece input,MessageLite *msg)

{
  long lVar1;
  char *local_a0;
  StringPiece input_local;
  ParseContext ctx;
  
  input_local.length_ = (stringpiece_ssize_type)input.ptr_;
  input_local.ptr_ = (char *)this;
  ParseContext::ParseContext<google::protobuf::StringPiece&>
            (&ctx,io::CodedInputStream::default_recursion_limit_,true,&local_a0,&input_local);
  lVar1 = (**(code **)(*(long *)input.length_ + 0x68))((long *)input.length_,local_a0,&ctx);
  return ctx.super_EpsCopyInputStream.last_tag_minus_1_ == 0 && lVar1 != 0;
}

Assistant:

bool MergePartialFromImpl(StringPiece input, MessageLite* msg) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has an explicit limit set (length of string_view).
  return ptr && ctx.EndedAtLimit();
}